

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

bool __thiscall
ImplicitDepLoader::LoadDepFile(ImplicitDepLoader *this,Edge *edge,string *path,string *err)

{
  size_t *len;
  size_t __n;
  pointer pcVar1;
  Metrics *this_00;
  undefined8 this_01;
  Edge *edge_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var6;
  Node *pNVar7;
  undefined8 *puVar8;
  Metric *pMVar9;
  size_type *psVar10;
  Node **ppNVar11;
  _Alloc_hider this_02;
  ulong *puVar12;
  ulong uVar13;
  StringPiece *pSVar14;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  uint64_t slash_bits;
  string depfile_err;
  string content;
  DepfileParser depfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  ScopedMetric metrics_h_scoped;
  uint64_t unused;
  ulong *local_158;
  undefined8 local_150;
  ulong local_148;
  undefined8 uStack_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  string local_f8;
  undefined1 local_d8 [32];
  StringPiece *local_b8;
  pointer local_b0;
  Edge *local_a0;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  Node **local_58;
  StringPiece *local_50;
  ScopedMetric local_48;
  uint64_t local_38;
  
  if ((LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar9 = (Metric *)0x0;
    }
    else {
      local_d8._0_8_ = (StringPiece *)(local_d8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"depfile load","");
      pMVar9 = Metrics::NewMetric(this_00,(string *)local_d8);
      if ((StringPiece *)local_d8._0_8_ != (StringPiece *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
      }
    }
    LoadDepFile::metrics_h_metric = pMVar9;
    __cxa_guard_release(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_48,LoadDepFile::metrics_h_metric);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  iVar4 = (**(code **)(*(long *)this->disk_interface_ + 0x10))
                    (this->disk_interface_,path,&local_f8,err);
  if (iVar4 == 1) {
    err->_M_string_length = 0;
    *(err->_M_dataplus)._M_p = '\0';
LAB_00115611:
    if (local_f8._M_string_length != 0) {
      DepfileParser::DepfileParser((DepfileParser *)local_d8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity =
           local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar2 = DepfileParser::Parse((DepfileParser *)local_d8,&local_f8,&local_118);
      this_01 = local_d8._0_8_;
      if (bVar2) {
        if (local_d8._0_8_ == local_d8._8_8_) {
          pcVar1 = (path->_M_dataplus)._M_p;
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,pcVar1,pcVar1 + path->_M_string_length);
          std::__cxx11::string::append((char *)&local_138);
          std::__cxx11::string::operator=((string *)err,(string *)&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          bVar2 = false;
        }
        else {
          len = (size_t *)(local_d8._0_8_ + 8);
          local_a0 = edge;
          bVar2 = CanonicalizePath(*(char **)local_d8._0_8_,len,&local_38,err);
          if (!bVar2) {
            local_158 = &local_148;
            pcVar1 = (path->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_158,pcVar1,pcVar1 + path->_M_string_length);
            std::__cxx11::string::append((char *)&local_158);
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_158,(ulong)(err->_M_dataplus)._M_p);
            goto LAB_001158da;
          }
          pNVar7 = *(local_a0->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                    .super__Vector_impl_data._M_start;
          this_02._M_p = (pNVar7->path_)._M_dataplus._M_p;
          __n = (pNVar7->path_)._M_string_length;
          if ((__n == *len) &&
             (iVar4 = bcmp(this_02._M_p,*(void **)this_01,__n), edge_00 = local_a0, iVar4 == 0)) {
            if (local_d8._0_8_ != local_d8._8_8_) {
              ppNVar11 = (local_a0->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              pSVar14 = (StringPiece *)local_d8._0_8_;
              do {
                this_02._M_p = (pointer)(edge_00->outputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_start;
                _Var6 = std::
                        __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_pred<matches>>
                                  (this_02._M_p,ppNVar11,pSVar14);
                ppNVar11 = (edge_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                if (_Var6._M_current == ppNVar11) {
                  pcVar1 = (path->_M_dataplus)._M_p;
                  local_78 = local_68;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_78,pcVar1,pcVar1 + path->_M_string_length);
                  std::__cxx11::string::append((char *)&local_78);
                  local_98 = &local_88;
                  if (pSVar14->len_ == 0) {
                    local_90 = 0;
                    local_88 = 0;
                  }
                  else {
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_98,pSVar14->str_,pSVar14->str_ + pSVar14->len_);
                  }
                  uVar13 = 0xf;
                  if (local_78 != local_68) {
                    uVar13 = local_68[0];
                  }
                  if (uVar13 < (ulong)(local_90 + local_70)) {
                    uVar13 = 0xf;
                    if (local_98 != &local_88) {
                      uVar13 = CONCAT71(uStack_87,local_88);
                    }
                    if (uVar13 < (ulong)(local_90 + local_70)) goto LAB_00115c0f;
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
                  }
                  else {
LAB_00115c0f:
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
                  }
                  local_158 = &local_148;
                  puVar12 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar12) {
                    local_148 = *puVar12;
                    uStack_140 = puVar8[3];
                  }
                  else {
                    local_148 = *puVar12;
                    local_158 = (ulong *)*puVar8;
                  }
                  local_150 = puVar8[1];
                  *puVar8 = puVar12;
                  puVar8[1] = 0;
                  *(undefined1 *)puVar12 = 0;
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
                  psVar10 = (size_type *)(plVar5 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar5 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar10) {
                    local_138.field_2._M_allocated_capacity = *psVar10;
                    local_138.field_2._8_8_ = plVar5[3];
                    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                  }
                  else {
                    local_138.field_2._M_allocated_capacity = *psVar10;
                    local_138._M_dataplus._M_p = (pointer)*plVar5;
                  }
                  local_138._M_string_length = plVar5[1];
                  *plVar5 = (long)psVar10;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  std::__cxx11::string::operator=((string *)err,(string *)&local_138);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p != &local_138.field_2) {
                    operator_delete(local_138._M_dataplus._M_p,
                                    local_138.field_2._M_allocated_capacity + 1);
                  }
                  if (local_158 != &local_148) {
                    operator_delete(local_158,local_148 + 1);
                  }
                  if (local_98 != &local_88) {
                    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
                  }
                  puVar12 = local_78;
                  if (local_78 != local_68) goto LAB_0011595a;
                  goto LAB_00115962;
                }
                pSVar14 = pSVar14 + 1;
              } while (pSVar14 != (StringPiece *)local_d8._8_8_);
            }
            local_58 = (Node **)PreallocateSpace((ImplicitDepLoader *)this_02._M_p,edge_00,
                                                 (int)((ulong)((long)local_b8 - local_d8._24_8_) >>
                                                      4));
            bVar2 = true;
            local_50 = (StringPiece *)local_d8._24_8_;
            if ((StringPiece *)local_d8._24_8_ != local_b8) {
              lVar15 = 0;
              do {
                pSVar14 = (StringPiece *)((long)&local_50->str_ + lVar15 * 2);
                bVar3 = CanonicalizePath(pSVar14->str_,&pSVar14->len_,(uint64_t *)&local_138,err);
                if (!bVar3) goto LAB_00115ba0;
                pNVar7 = State::GetNode(this->state_,*pSVar14,(uint64_t)local_138._M_dataplus._M_p);
                *(Node **)((long)local_58 + lVar15) = pNVar7;
                Node::AddOutEdge(pNVar7,local_a0);
                CreatePhonyInEdge(this,pNVar7);
                lVar15 = lVar15 + 8;
              } while (pSVar14 + 1 != local_b8);
            }
          }
          else if (g_explaining == true) {
            StringPiece::AsString_abi_cxx11_(&local_138,(StringPiece *)this_01);
            LoadDepFile();
LAB_00115ba0:
            bVar2 = false;
          }
          else {
            bVar2 = false;
          }
        }
      }
      else {
        local_158 = &local_148;
        pcVar1 = (path->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,pcVar1,pcVar1 + path->_M_string_length);
        std::__cxx11::string::append((char *)&local_158);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_158,(ulong)local_118._M_dataplus._M_p);
LAB_001158da:
        psVar10 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_138.field_2._M_allocated_capacity = *psVar10;
          local_138.field_2._8_8_ = plVar5[3];
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar10;
          local_138._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_138._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::operator=((string *)err,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        local_68[0] = local_148;
        puVar12 = local_158;
        if (local_158 != &local_148) {
LAB_0011595a:
          operator_delete(puVar12,local_68[0] + 1);
        }
LAB_00115962:
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((StringPiece *)local_d8._24_8_ != (StringPiece *)0x0) {
        operator_delete((void *)local_d8._24_8_,(long)local_b0 - local_d8._24_8_);
      }
      if ((StringPiece *)local_d8._0_8_ != (StringPiece *)0x0) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
      }
      goto LAB_001159b5;
    }
    if (g_explaining == true) {
      LoadDepFile((ImplicitDepLoader *)path);
    }
  }
  else {
    if (iVar4 != 2) goto LAB_00115611;
    std::operator+(&local_138,"loading \'",path);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
    puVar12 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_118.field_2._M_allocated_capacity = *puVar12;
      local_118.field_2._8_8_ = plVar5[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *puVar12;
      local_118._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_118._M_string_length = plVar5[1];
    *plVar5 = (long)puVar12;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_118,(ulong)(err->_M_dataplus)._M_p);
    pSVar14 = (StringPiece *)(plVar5 + 2);
    if ((StringPiece *)*plVar5 == pSVar14) {
      local_d8._16_8_ = pSVar14->str_;
      local_d8._24_8_ = plVar5[3];
      local_d8._0_8_ = (StringPiece *)(local_d8 + 0x10);
    }
    else {
      local_d8._16_8_ = pSVar14->str_;
      local_d8._0_8_ = (StringPiece *)*plVar5;
    }
    local_d8._8_8_ = plVar5[1];
    *plVar5 = (long)pSVar14;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)local_d8);
    if ((StringPiece *)local_d8._0_8_ != (StringPiece *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = false;
LAB_001159b5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  ScopedMetric::~ScopedMetric(&local_48);
  return bVar2;
}

Assistant:

bool ImplicitDepLoader::LoadDepFile(Edge* edge, const string& path,
                                    string* err) {
  METRIC_RECORD("depfile load");
  // Read depfile content.  Treat a missing depfile as empty.
  string content;
  switch (disk_interface_->ReadFile(path, &content, err)) {
  case DiskInterface::Okay:
    break;
  case DiskInterface::NotFound:
    err->clear();
    break;
  case DiskInterface::OtherError:
    *err = "loading '" + path + "': " + *err;
    return false;
  }
  // On a missing depfile: return false and empty *err.
  if (content.empty()) {
    EXPLAIN("depfile '%s' is missing", path.c_str());
    return false;
  }

  DepfileParser depfile(depfile_parser_options_
                        ? *depfile_parser_options_
                        : DepfileParserOptions());
  string depfile_err;
  if (!depfile.Parse(&content, &depfile_err)) {
    *err = path + ": " + depfile_err;
    return false;
  }

  if (depfile.outs_.empty()) {
    *err = path + ": no outputs declared";
    return false;
  }

  uint64_t unused;
  std::vector<StringPiece>::iterator primary_out = depfile.outs_.begin();
  if (!CanonicalizePath(const_cast<char*>(primary_out->str_),
                        &primary_out->len_, &unused, err)) {
    *err = path + ": " + *err;
    return false;
  }

  // Check that this depfile matches the edge's output, if not return false to
  // mark the edge as dirty.
  Node* first_output = edge->outputs_[0];
  StringPiece opath = StringPiece(first_output->path());
  if (opath != *primary_out) {
    EXPLAIN("expected depfile '%s' to mention '%s', got '%s'", path.c_str(),
            first_output->path().c_str(), primary_out->AsString().c_str());
    return false;
  }

  // Ensure that all mentioned outputs are outputs of the edge.
  for (std::vector<StringPiece>::iterator o = depfile.outs_.begin();
       o != depfile.outs_.end(); ++o) {
    matches m(o);
    if (std::find_if(edge->outputs_.begin(), edge->outputs_.end(), m) == edge->outputs_.end()) {
      *err = path + ": depfile mentions '" + o->AsString() + "' as an output, but no such output was declared";
      return false;
    }
  }

  // Preallocate space in edge->inputs_ to be filled in below.
  vector<Node*>::iterator implicit_dep =
      PreallocateSpace(edge, depfile.ins_.size());

  // Add all its in-edges.
  for (vector<StringPiece>::iterator i = depfile.ins_.begin();
       i != depfile.ins_.end(); ++i, ++implicit_dep) {
    uint64_t slash_bits;
    if (!CanonicalizePath(const_cast<char*>(i->str_), &i->len_, &slash_bits,
                          err))
      return false;

    Node* node = state_->GetNode(*i, slash_bits);
    *implicit_dep = node;
    node->AddOutEdge(edge);
    CreatePhonyInEdge(node);
  }

  return true;
}